

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyViewport(ImGuiViewportP *viewport)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiContext_conflict *local_30;
  ImGuiWindow *local_28;
  ImGuiWindow *window;
  ImGuiContext_conflict *pIStack_18;
  int window_n;
  ImGuiContext_conflict *g;
  ImGuiViewportP *viewport_local;
  
  pIStack_18 = GImGui;
  g = (ImGuiContext_conflict *)viewport;
  for (window._4_4_ = 0; window._4_4_ < (pIStack_18->Windows).Size; window._4_4_ = window._4_4_ + 1)
  {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIStack_18->Windows,window._4_4_);
    local_28 = *ppIVar2;
    if ((ImGuiContext_conflict *)local_28->Viewport == g) {
      local_28->Viewport = (ImGuiViewportP *)0x0;
      local_28->ViewportOwned = false;
    }
  }
  if (g == (ImGuiContext_conflict *)pIStack_18->MouseLastHoveredViewport) {
    pIStack_18->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
  }
  DestroyPlatformWindow((ImGuiViewportP *)g);
  local_30 = g;
  bVar1 = ImVector<ImGuiViewport_*>::contains
                    (&(pIStack_18->PlatformIO).Viewports,(ImGuiViewport **)&local_30);
  if (bVar1) {
    __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2f5b,"void ImGui::DestroyViewport(ImGuiViewportP *)");
  }
  ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&pIStack_18->Viewports,(g->IO).KeyMap[8]);
  if ((ImGuiContext_conflict *)*ppIVar3 != g) {
    __assert_fail("g.Viewports[viewport->Idx] == viewport",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2f5c,"void ImGui::DestroyViewport(ImGuiViewportP *)");
  }
  ImVector<ImGuiViewportP_*>::erase
            (&pIStack_18->Viewports,(pIStack_18->Viewports).Data + (g->IO).KeyMap[8]);
  IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)g);
  return;
}

Assistant:

static void ImGui::DestroyViewport(ImGuiViewportP* viewport)
{
    // Clear references to this viewport in windows (window->ViewportId becomes the master data)
    ImGuiContext& g = *GImGui;
    for (int window_n = 0; window_n < g.Windows.Size; window_n++)
    {
        ImGuiWindow* window = g.Windows[window_n];
        if (window->Viewport != viewport)
            continue;
        window->Viewport = NULL;
        window->ViewportOwned = false;
    }
    if (viewport == g.MouseLastHoveredViewport)
        g.MouseLastHoveredViewport = NULL;

    // Destroy
    IMGUI_DEBUG_LOG_VIEWPORT("Delete Viewport %08X (%s)\n", viewport->ID, viewport->Window ? viewport->Window->Name : "n/a");
    DestroyPlatformWindow(viewport); // In most circumstances the platform window will already be destroyed here.
    IM_ASSERT(g.PlatformIO.Viewports.contains(viewport) == false);
    IM_ASSERT(g.Viewports[viewport->Idx] == viewport);
    g.Viewports.erase(g.Viewports.Data + viewport->Idx);
    IM_DELETE(viewport);
}